

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

UnicodeString *
icu_63::ZoneMeta::formatCustomID
          (uint8_t hour,uint8_t min,uint8_t sec,UBool negative,UnicodeString *id)

{
  UnicodeString *id_local;
  UBool negative_local;
  uint8_t sec_local;
  uint8_t min_local;
  uint8_t hour_local;
  
  icu_63::UnicodeString::setTo(id,L"GMT",-1);
  if ((hour != '\0') || (min != '\0')) {
    if (negative == '\0') {
      icu_63::UnicodeString::append(id,L'+');
    }
    else {
      icu_63::UnicodeString::append(id,L'-');
    }
    icu_63::UnicodeString::append(id,(short)(((ulong)hour % 100) / 10) + L'0');
    icu_63::UnicodeString::append(id,(ushort)hour % 10 + L'0');
    icu_63::UnicodeString::append(id,L':');
    icu_63::UnicodeString::append(id,(short)(((ulong)min % 100) / 10) + L'0');
    icu_63::UnicodeString::append(id,(ushort)min % 10 + L'0');
    if (sec != '\0') {
      icu_63::UnicodeString::append(id,L':');
      icu_63::UnicodeString::append(id,(short)(((ulong)sec % 100) / 10) + L'0');
      icu_63::UnicodeString::append(id,(ushort)sec % 10 + L'0');
    }
  }
  return id;
}

Assistant:

UnicodeString&
ZoneMeta::formatCustomID(uint8_t hour, uint8_t min, uint8_t sec, UBool negative, UnicodeString& id) {
    // Create normalized time zone ID - GMT[+|-]HH:mm[:ss]
    id.setTo(gCustomTzPrefix, -1);
    if (hour != 0 || min != 0) {
        if (negative) {
          id.append((UChar)0x2D);    // '-'
        } else {
          id.append((UChar)0x2B);    // '+'
        }
        // Always use US-ASCII digits
        id.append((UChar)(0x30 + (hour%100)/10));
        id.append((UChar)(0x30 + (hour%10)));
        id.append((UChar)0x3A);    // ':'
        id.append((UChar)(0x30 + (min%100)/10));
        id.append((UChar)(0x30 + (min%10)));
        if (sec != 0) {
          id.append((UChar)0x3A);    // ':'
          id.append((UChar)(0x30 + (sec%100)/10));
          id.append((UChar)(0x30 + (sec%10)));
        }
    }
    return id;
}